

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O0

float Internal_ON__fltinithelper(int i)

{
  uint i2;
  uint i3;
  anon_union_4_2_94730037 u;
  int i_local;
  
  i2 = 0x40000000;
  if (i == 1) {
    i2._3_1_ = 0x7f;
    i2._2_1_ = 0xc0;
    i2._0_1_ = 0;
  }
  else if (i == 2) {
    i2._3_1_ = 0x7f;
    i2._2_1_ = 0x80;
    i2._0_1_ = 0;
  }
  else {
    i2 = 0xffffffff;
  }
  return (float)i2;
}

Assistant:

static float Internal_ON__fltinithelper(int i)
{
  // called twice - performance is not important
  union
  {
    float x;
    unsigned char b[4];
  } u;
  unsigned int i3, i2;

  // different bytes on
  u.x = 2.0f; // sign = 0; mantissa = 0; exponent = 1000 0000
  if (0x40 == u.b[3] && 0 == u.b[0] && 0 == u.b[1] && 0 == u.b[2])
  {
    // little endian doubles
    i3 = 3; i2 = 2;
  }
  else if (0x40 == u.b[0] && 0 == u.b[3] && 0 == u.b[1] && 0 == u.b[2])
  {
    // big endian doubles
    i3 = 0; i2 = 1;
  }
  else
  {
    // this situation is not handled by this algorithm
    // and that is a bug in the algorithm.
    ON_ERROR("CPU has unexpected bit pattern in float 2.0f.");
    i3 = 0;
    i2 = 0;
    i = 99;
  }

  if (1 == i) // positive quiet NaN
  {
    // all exponent bits = 1
    // fraction bits = 100...0
    u.b[i3] = 0x7F; // 0111 1111
    u.b[i2] = 0xC0; // 1100 0000
    u.b[3 - i2] = 0;    // 0...
    u.b[3 - i3] = 0;
  }
  else if (2 == i) // positive infinity
  {
    // all exponent bits = 1
    // all fraction bits = 0
    u.b[i3] = 0x7F; // 0111 1111
    u.b[i2] = 0x80; // 1000 0000
    u.b[3 - i2] = 0;    // 0...
    u.b[3 - i3] = 0;
  }
  else
  {
    // invalid input 
    u.b[0] = 0xFF;
    u.b[1] = 0xFF;
    u.b[2] = 0xFF;
    u.b[3] = 0xFF;
  }

  return u.x;
}